

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O0

UBool putil_cleanup(void)

{
  CharString *pCVar1;
  void *in_RSI;
  
  if ((gDataDirectory != (char *)0x0) && (*gDataDirectory != '\0')) {
    uprv_free_63(gDataDirectory);
  }
  gDataDirectory = (char *)0x0;
  icu_63::UInitOnce::reset(&gDataDirInitOnce);
  pCVar1 = gTimeZoneFilesDirectory;
  if (gTimeZoneFilesDirectory != (CharString *)0x0) {
    icu_63::CharString::~CharString(gTimeZoneFilesDirectory);
    icu_63::UMemory::operator_delete((UMemory *)pCVar1,in_RSI);
  }
  gTimeZoneFilesDirectory = (CharString *)0x0;
  icu_63::UInitOnce::reset(&gTimeZoneFilesInitOnce_63);
  pCVar1 = gSearchTZFileResult;
  if (gSearchTZFileResult != (CharString *)0x0) {
    icu_63::CharString::~CharString(gSearchTZFileResult);
    icu_63::UMemory::operator_delete((UMemory *)pCVar1,in_RSI);
  }
  gSearchTZFileResult = (CharString *)0x0;
  if ((gCorrectedPOSIXLocale != (char *)0x0) && ((gCorrectedPOSIXLocaleHeapAllocated & 1U) != 0)) {
    uprv_free_63(gCorrectedPOSIXLocale);
    gCorrectedPOSIXLocale = (char *)0x0;
    gCorrectedPOSIXLocaleHeapAllocated = false;
  }
  return '\x01';
}

Assistant:

static UBool U_CALLCONV putil_cleanup(void)
{
    if (gDataDirectory && *gDataDirectory) {
        uprv_free(gDataDirectory);
    }
    gDataDirectory = NULL;
    gDataDirInitOnce.reset();

    delete gTimeZoneFilesDirectory;
    gTimeZoneFilesDirectory = NULL;
    gTimeZoneFilesInitOnce.reset();

#ifdef SEARCH_TZFILE
    delete gSearchTZFileResult;
    gSearchTZFileResult = NULL;
#endif

#if U_POSIX_LOCALE || U_PLATFORM_USES_ONLY_WIN32_API
    if (gCorrectedPOSIXLocale && gCorrectedPOSIXLocaleHeapAllocated) {
        uprv_free(const_cast<char *>(gCorrectedPOSIXLocale));
        gCorrectedPOSIXLocale = NULL;
        gCorrectedPOSIXLocaleHeapAllocated = false;
    }
#endif
    return TRUE;
}